

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkDropTable(Parse *pParse,SrcList *pName,Table *pTab)

{
  sqlite3 *db_00;
  int iVar1;
  Vdbe *p_00;
  FKey *pFVar2;
  SrcList *pTabList;
  FKey *local_40;
  FKey *p;
  Vdbe *v;
  int iSkip;
  sqlite3 *db;
  Table *pTab_local;
  SrcList *pName_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (((db_00->flags & 0x4000) != 0) && (pTab->nModuleArg == 0)) {
    v._4_4_ = 0;
    p_00 = sqlite3GetVdbe(pParse);
    pFVar2 = sqlite3FkReferences(pTab);
    if (pFVar2 == (FKey *)0x0) {
      local_40 = pTab->pFKey;
      while (((local_40 != (FKey *)0x0 && (local_40->isDeferred == '\0')) &&
             ((db_00->flags & 0x80000) == 0))) {
        local_40 = local_40->pNextFrom;
      }
      if (local_40 == (FKey *)0x0) {
        return;
      }
      v._4_4_ = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(p_00,0x2e,1,v._4_4_);
    }
    pParse->disableTriggers = '\x01';
    pTabList = sqlite3SrcListDup(db_00,pName,0);
    sqlite3DeleteFrom(pParse,pTabList,(Expr *)0x0,(ExprList *)0x0,(Expr *)0x0);
    pParse->disableTriggers = '\0';
    if ((db_00->flags & 0x80000) == 0) {
      iVar1 = sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp2(p_00,0x2e,0,iVar1 + 2);
      sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
    }
    if (v._4_4_ != 0) {
      sqlite3VdbeResolveLabel(p_00,v._4_4_);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkDropTable(Parse *pParse, SrcList *pName, Table *pTab){
  sqlite3 *db = pParse->db;
  if( (db->flags&SQLITE_ForeignKeys) && !IsVirtual(pTab) ){
    int iSkip = 0;
    Vdbe *v = sqlite3GetVdbe(pParse);

    assert( v );                  /* VDBE has already been allocated */
    assert( pTab->pSelect==0 );   /* Not a view */
    if( sqlite3FkReferences(pTab)==0 ){
      /* Search for a deferred foreign key constraint for which this table
      ** is the child table. If one cannot be found, return without 
      ** generating any VDBE code. If one can be found, then jump over
      ** the entire DELETE if there are no outstanding deferred constraints
      ** when this statement is run.  */
      FKey *p;
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( p->isDeferred || (db->flags & SQLITE_DeferFKs) ) break;
      }
      if( !p ) return;
      iSkip = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(v, OP_FkIfZero, 1, iSkip); VdbeCoverage(v);
    }

    pParse->disableTriggers = 1;
    sqlite3DeleteFrom(pParse, sqlite3SrcListDup(db, pName, 0), 0, 0, 0);
    pParse->disableTriggers = 0;

    /* If the DELETE has generated immediate foreign key constraint 
    ** violations, halt the VDBE and return an error at this point, before
    ** any modifications to the schema are made. This is because statement
    ** transactions are not able to rollback schema changes.  
    **
    ** If the SQLITE_DeferFKs flag is set, then this is not required, as
    ** the statement transaction will not be rolled back even if FK
    ** constraints are violated.
    */
    if( (db->flags & SQLITE_DeferFKs)==0 ){
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      sqlite3VdbeAddOp2(v, OP_FkIfZero, 0, sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
      sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
          OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
    }

    if( iSkip ){
      sqlite3VdbeResolveLabel(v, iSkip);
    }
  }
}